

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O0

tuple<NS_*,_NS_*,_NS_*> * test_graphs::nat_has(bool replacement)

{
  NS *graph;
  N *this;
  char *data;
  N *this_00;
  N *pNVar1;
  void *pvVar2;
  byte in_SIL;
  tuple<NS_*,_NS_*,_NS_*> *in_RDI;
  N *m;
  N *add_e;
  NS *changed;
  N *np;
  N *p;
  N *y;
  N *x;
  NS *to_match;
  N *opp;
  N *bot;
  N *top;
  N *is;
  N *has;
  N *n3;
  N *n2;
  N *n1;
  NS *g;
  tuple<NS_*,_NS_*,_NS_*> *__elements_1;
  size_t in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  N *in_stack_fffffffffffffe20;
  N *local_170;
  sockaddr *local_168;
  undefined8 local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  sockaddr *local_138;
  undefined8 local_130;
  N *local_128;
  sockaddr *local_120;
  undefined8 local_118;
  void *local_110;
  N *local_108;
  N *local_100;
  N *local_f8;
  void *local_f0;
  N *local_e8;
  sockaddr *local_e0;
  undefined8 local_d8;
  N *local_d0;
  sockaddr *local_c8;
  undefined8 local_c0;
  N *local_b8;
  sockaddr *local_b0;
  undefined8 local_a8;
  N *local_a0;
  sockaddr *local_98;
  undefined8 local_90;
  N *local_88;
  sockaddr *local_80;
  undefined8 local_78;
  char *local_70;
  sockaddr *local_68;
  undefined8 local_60;
  void *local_58;
  N *local_50;
  N *local_48;
  N *local_40;
  N *local_38;
  N *local_30;
  char *local_28;
  N *local_20;
  NS *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  __elements_1 = in_RDI;
  graph = (NS *)operator_new(0x18);
  memset(graph,0,0x18);
  NS::NS((NS *)0x19a6ff);
  local_18 = graph;
  this = (N *)N::operator_new(in_stack_fffffffffffffe10,graph);
  N::N<char_const*>(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_20 = this;
  data = (char *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(in_stack_fffffffffffffe20,data);
  local_28 = data;
  this_00 = (N *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_30 = this_00;
  pNVar1 = (N *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_38 = pNVar1;
  pNVar1 = (N *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_40 = pNVar1;
  pNVar1 = (N *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_48 = pNVar1;
  pNVar1 = (N *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_50 = pNVar1;
  pvVar2 = N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_70 = local_28;
  local_68 = (sockaddr *)&local_70;
  local_60 = 1;
  local_58 = pvVar2;
  N::connect(local_20,(int)local_38,local_68,1);
  local_88 = local_30;
  local_80 = (sockaddr *)&local_88;
  local_78 = 1;
  N::connect(local_20,(int)local_48,local_80,1);
  local_a0 = local_40;
  local_98 = (sockaddr *)&local_a0;
  local_90 = 1;
  N::connect(local_38,(int)local_58,local_98,1);
  local_b8 = local_38;
  local_b0 = (sockaddr *)&local_b8;
  local_a8 = 1;
  N::connect(local_40,(int)local_58,local_b0,1);
  local_d0 = local_50;
  local_c8 = (sockaddr *)&local_d0;
  local_c0 = 1;
  N::connect(local_48,(int)local_58,local_c8,1);
  local_e8 = local_48;
  local_e0 = (sockaddr *)&local_e8;
  local_d8 = 1;
  N::connect(local_50,(int)local_58,local_e0,1);
  pvVar2 = operator_new(0x18);
  memset(pvVar2,0,0x18);
  NS::NS((NS *)0x19aab2);
  local_f0 = pvVar2;
  pNVar1 = (N *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_f8 = pNVar1;
  pNVar1 = (N *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_100 = pNVar1;
  pNVar1 = (N *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_108 = pNVar1;
  pvVar2 = N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_128 = local_100;
  local_120 = (sockaddr *)&local_128;
  local_118 = 1;
  local_110 = pvVar2;
  N::connect(local_f8,(int)local_108,local_120,1);
  local_140 = local_110;
  local_138 = (sockaddr *)&local_140;
  local_130 = 1;
  N::connect(local_108,(int)local_58,local_138,1);
  pvVar2 = operator_new(0x18);
  memset(pvVar2,0,0x18);
  NS::NS((NS *)0x19ac5b);
  local_148 = pvVar2;
  pvVar2 = N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_150 = pvVar2;
  pvVar2 = N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,data);
  local_158 = pvVar2;
  if ((local_9 & 1) != 0) {
    local_170 = local_f8;
    local_168 = (sockaddr *)&local_170;
    local_160 = 1;
    N::connect(local_100,(int)local_110,local_168,1);
  }
  std::tuple<NS_*,_NS_*,_NS_*>::tuple<NS_*&,_NS_*&,_NS_*&,_true,_true>
            ((tuple<NS_*,_NS_*,_NS_*> *)this,(NS **)graph,(NS **)__elements_1,(NS **)in_RDI);
  return __elements_1;
}

Assistant:

std::tuple<NS*, NS*, NS*> test_graphs::nat_has(bool replacement) {
    auto g = new NS();
    auto n1 = new(g) N("Box"), n2 = new(g) N("Pyramid"), n3 = new(g) N("Ball");
    auto has = new(g) N("Left"), is = new(g) N("Right");
    auto top = new(g) N("Top"), bot = new(g) N("Bottom");
    auto opp = new(g) N("opposite");

    n1->connect(has, {n2});
    n1->connect(top, {n3});
    has->connect(opp, {is});
    is->connect(opp, {has});
    top->connect(opp, {bot});
    bot->connect(opp, {top});

    auto to_match = new NS();
    auto x = new(to_match) N("Object 1"), y = new(to_match) N("Object 2");
    auto p = new(to_match) N("generic property"), np = new(to_match) N("generic anti property");
    x->connect(p, {y});
    p->connect(opp, {np});

    auto changed = new NS();
    auto add_e = new(changed) N("new");
    auto m = new(changed) N("match");

    if (replacement) {
        y->connect(np, {x});
        //y->connect(add_e, {x});
    }

    return {g, to_match, changed};
}